

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool checkInterfaceDirs(string *prepro,cmGeneratorTarget *target,string *prop)

{
  cmMakefile *this;
  MessageType t;
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  PolicyStatus PVar8;
  string *b;
  cmLocalGenerator *pcVar9;
  string *__lhs;
  string *__rhs;
  size_type sVar10;
  ostream *poVar11;
  string *psVar12;
  PolicyID id;
  PolicyID id_00;
  pointer input;
  char *pcVar13;
  string_view str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string local_340;
  ostringstream s;
  ostringstream e;
  
  this = target->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&s);
  b = cmMakefile::GetSafeDefinition(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
  __lhs = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar9);
  pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
  __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar9);
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorExpression::Split(prepro,&parts);
  _Var2 = std::operator==(__lhs,__rhs);
  pbVar1 = parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = 0;
  input = parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (input == pbVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parts);
      return (bool)(~bVar4 & 1);
    }
    sVar10 = cmGeneratorExpression::Find(input);
    if ((sVar10 != 0) &&
       (str._M_str = (input->_M_dataplus)._M_p, str._M_len = input->_M_string_length,
       bVar3 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])0x597da8), !bVar3)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      if (sVar10 != 0xffffffffffffffff) {
        bVar3 = std::operator==(prop,"INTERFACE_INCLUDE_DIRECTORIES");
        if ((!bVar3) || (PVar8 = cmGeneratorTarget::GetPolicyStatusCMP0041(target), PVar8 - NEW < 3)
           ) {
          bVar4 = 1;
          goto LAB_0029393c;
        }
        if (PVar8 != OLD) {
          if (PVar8 != WARN) goto LAB_0029393c;
          cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&s,(cmPolicies *)&DAT_00000029,id);
          poVar11 = std::operator<<((ostream *)&e,(string *)&s);
          std::operator<<(poVar11,"\n");
          std::__cxx11::string::~string((string *)&s);
          t = WARNING;
          goto LAB_0029393e;
        }
        goto LAB_00293d62;
      }
LAB_0029393c:
      t = FATAL_ERROR;
LAB_0029393e:
      bVar3 = cmsys::SystemTools::FileIsFullPath(input);
      if (!bVar3) {
        poVar11 = std::operator<<((ostream *)&e,"Target \"");
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar11 = std::operator<<(poVar11,(string *)psVar12);
        poVar11 = std::operator<<(poVar11,"\" ");
        poVar11 = std::operator<<(poVar11,(string *)prop);
        poVar11 = std::operator<<(poVar11," property contains relative path:\n  \"");
        poVar11 = std::operator<<(poVar11,(string *)input);
        std::operator<<(poVar11,"\"");
        pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(pcVar9,t,(string *)&s);
        std::__cxx11::string::~string((string *)&s);
      }
      bVar3 = isSubDirectory(input,__rhs);
      bVar5 = isSubDirectory(input,__lhs);
      bVar6 = isSubDirectory(input,b);
      if (bVar6) {
        if (bVar3) {
          bVar6 = isSubDirectory(b,__rhs);
          if (bVar5 && bVar6) {
LAB_00293a54:
            bVar6 = isSubDirectory(b,__lhs);
          }
        }
        else {
          bVar6 = true;
          if (bVar5) goto LAB_00293a54;
        }
        bVar7 = std::operator==(prop,"INTERFACE_INCLUDE_DIRECTORIES");
        if ((bVar6 == false) && (bVar7)) {
          PVar8 = cmGeneratorTarget::GetPolicyStatusCMP0052(target);
          if (PVar8 != OLD) {
            if (PVar8 != WARN) goto LAB_00293be3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_340,(cmPolicies *)0x34,id_00);
            poVar11 = std::operator<<((ostream *)&s,(string *)&local_340);
            std::operator<<(poVar11,"\n");
            std::__cxx11::string::~string((string *)&local_340);
            poVar11 = std::operator<<((ostream *)&s,"Directory:\n    \"");
            poVar11 = std::operator<<(poVar11,(string *)input);
            poVar11 = std::operator<<(poVar11,"\"\nin INTERFACE_INCLUDE_DIRECTORIES of target \"");
            psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
            poVar11 = std::operator<<(poVar11,(string *)psVar12);
            poVar11 = std::operator<<(poVar11,
                                      "\" is a subdirectory of the install directory:\n    \"");
            poVar11 = std::operator<<(poVar11,(string *)b);
            poVar11 = std::operator<<(poVar11,"\"\nhowever it is also a subdirectory of the ");
            pcVar13 = "source";
            if (bVar3) {
              pcVar13 = "build";
            }
            poVar11 = std::operator<<(poVar11,pcVar13);
            poVar11 = std::operator<<(poVar11," tree:\n    \"");
            psVar12 = __lhs;
            if (bVar3) {
              psVar12 = __rhs;
            }
            poVar11 = std::operator<<(poVar11,(string *)psVar12);
            std::operator<<(poVar11,"\"\n");
            pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar9,AUTHOR_WARNING,&local_340);
            std::__cxx11::string::~string((string *)&local_340);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
          }
        }
        else {
LAB_00293be3:
          if (bVar6 == false) goto LAB_00293beb;
        }
      }
      else {
LAB_00293beb:
        if (bVar3) {
          poVar11 = std::operator<<((ostream *)&e,"Target \"");
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          poVar11 = std::operator<<(poVar11,(string *)psVar12);
          poVar11 = std::operator<<(poVar11,"\" ");
          poVar11 = std::operator<<(poVar11,(string *)prop);
          poVar11 = std::operator<<(poVar11," property contains path:\n  \"");
          poVar11 = std::operator<<(poVar11,(string *)input);
          std::operator<<(poVar11,"\"\nwhich is prefixed in the build directory.");
          pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar9,t,(string *)&s);
          std::__cxx11::string::~string((string *)&s);
        }
        if (bVar5 && !_Var2) {
          poVar11 = std::operator<<((ostream *)&e,"Target \"");
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          poVar11 = std::operator<<(poVar11,(string *)psVar12);
          poVar11 = std::operator<<(poVar11,"\" ");
          poVar11 = std::operator<<(poVar11,(string *)prop);
          poVar11 = std::operator<<(poVar11," property contains path:\n  \"");
          poVar11 = std::operator<<(poVar11,(string *)input);
          std::operator<<(poVar11,"\"\nwhich is prefixed in the source directory.");
          pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar9,t,(string *)&s);
          std::__cxx11::string::~string((string *)&s);
        }
      }
LAB_00293d62:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    input = input + 1;
  } while( true );
}

Assistant:

static bool checkInterfaceDirs(const std::string& prepro,
                               cmGeneratorTarget const* target,
                               const std::string& prop)
{
  std::string const& installDir =
    target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& topSourceDir =
    target->GetLocalGenerator()->GetSourceDirectory();
  std::string const& topBinaryDir =
    target->GetLocalGenerator()->GetBinaryDirectory();

  std::vector<std::string> parts;
  cmGeneratorExpression::Split(prepro, parts);

  const bool inSourceBuild = topSourceDir == topBinaryDir;

  bool hadFatalError = false;

  for (std::string const& li : parts) {
    size_t genexPos = cmGeneratorExpression::Find(li);
    if (genexPos == 0) {
      continue;
    }
    if (cmHasLiteralPrefix(li, "${_IMPORT_PREFIX}")) {
      continue;
    }
    MessageType messageType = MessageType::FATAL_ERROR;
    std::ostringstream e;
    if (genexPos != std::string::npos) {
      if (prop == "INTERFACE_INCLUDE_DIRECTORIES") {
        switch (target->GetPolicyStatusCMP0041()) {
          case cmPolicies::WARN:
            messageType = MessageType::WARNING;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0041) << "\n";
            break;
          case cmPolicies::OLD:
            continue;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            hadFatalError = true;
            break; // Issue fatal message.
        }
      } else {
        hadFatalError = true;
      }
    }
    if (!cmSystemTools::FileIsFullPath(li)) {
      /* clang-format off */
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains relative path:\n"
           "  \"" << li << "\"";
      /* clang-format on */
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
    }
    bool inBinary = isSubDirectory(li, topBinaryDir);
    bool inSource = isSubDirectory(li, topSourceDir);
    if (isSubDirectory(li, installDir)) {
      // The include directory is inside the install tree.  If the
      // install tree is not inside the source tree or build tree then
      // fall through to the checks below that the include directory is not
      // also inside the source tree or build tree.
      bool shouldContinue =
        (!inBinary || isSubDirectory(installDir, topBinaryDir)) &&
        (!inSource || isSubDirectory(installDir, topSourceDir));

      if (prop == "INTERFACE_INCLUDE_DIRECTORIES") {
        if (!shouldContinue) {
          switch (target->GetPolicyStatusCMP0052()) {
            case cmPolicies::WARN: {
              std::ostringstream s;
              s << cmPolicies::GetPolicyWarning(cmPolicies::CMP0052) << "\n";
              s << "Directory:\n    \"" << li
                << "\"\nin "
                   "INTERFACE_INCLUDE_DIRECTORIES of target \""
                << target->GetName()
                << "\" is a subdirectory of the install "
                   "directory:\n    \""
                << installDir
                << "\"\nhowever it is also "
                   "a subdirectory of the "
                << (inBinary ? "build" : "source") << " tree:\n    \""
                << (inBinary ? topBinaryDir : topSourceDir) << "\"\n";
              target->GetLocalGenerator()->IssueMessage(
                MessageType::AUTHOR_WARNING, s.str());
              CM_FALLTHROUGH;
            }
            case cmPolicies::OLD:
              shouldContinue = true;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
          }
        }
      }
      if (shouldContinue) {
        continue;
      }
    }
    if (inBinary) {
      /* clang-format off */
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains path:\n"
           "  \"" << li << "\"\nwhich is prefixed in the build directory.";
      /* clang-format on */
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
    }
    if (!inSourceBuild) {
      if (inSource) {
        e << "Target \"" << target->GetName() << "\" " << prop
          << " property contains path:\n"
             "  \""
          << li << "\"\nwhich is prefixed in the source directory.";
        target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    }
  }
  return !hadFatalError;
}